

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::MultiPartOutputFile::Data::do_header_sanity_checks
          (Data *this,bool overrideSharedAttributes)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  string *psVar4;
  size_type sVar5;
  byte in_SIL;
  long in_RDI;
  stringstream _iex_throw_s;
  size_t i_1;
  string excMsg;
  bool valid;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflictingAttributes;
  size_t i;
  bool isMultiPart;
  size_t parts;
  undefined1 in_stack_000019be;
  undefined1 in_stack_000019bf;
  Header *in_stack_000019c0;
  stringstream *in_stack_fffffffffffffd28;
  string *in_stack_fffffffffffffd30;
  Header *in_stack_fffffffffffffd38;
  Header *in_stack_fffffffffffffd40;
  ulong uVar6;
  Header *in_stack_fffffffffffffd48;
  Data *in_stack_fffffffffffffd50;
  vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *in_stack_fffffffffffffd58;
  int chunks;
  reference in_stack_fffffffffffffd60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__s;
  undefined7 in_stack_fffffffffffffd70;
  reference in_stack_fffffffffffffd78;
  stringstream local_248 [16];
  vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *in_stack_fffffffffffffdc8;
  Data *in_stack_fffffffffffffdd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe88;
  Header *in_stack_fffffffffffffe90;
  Header *in_stack_fffffffffffffe98;
  Data *in_stack_fffffffffffffea0;
  string local_c0 [32];
  string local_a0 [32];
  ulong local_80;
  allocator<char> local_71;
  string local_70 [39];
  undefined1 local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  size_type local_30;
  byte local_25;
  size_type local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_18 = std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::size
                       ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88)
                       );
  if (local_18 == 0) {
    uVar3 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
    __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  local_25 = 1 < local_18;
  std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
            ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
  std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
            ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
  Header::hasTileDescription((Header *)0x141063);
  Header::sanityCheck(in_stack_000019c0,(bool)in_stack_000019bf,(bool)in_stack_000019be);
  chunks = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  if ((local_25 & 1) == 0) {
    std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
              ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
    bVar1 = Header::hasType((Header *)0x141639);
    if (bVar1) {
      std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
      Header::type_abi_cxx11_((Header *)0x14165f);
      bVar1 = isImage(in_stack_fffffffffffffd30);
      if (!bVar1) {
        std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                  ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
        std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                  ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
        getChunkOffsetTableSize(in_stack_fffffffffffffd38);
        Header::setChunkCount(in_stack_fffffffffffffd60,chunks);
      }
    }
  }
  else {
    std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
              ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
    std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
              ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),0);
    getChunkOffsetTableSize(in_stack_fffffffffffffd38);
    Header::setChunkCount(in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20))
    ;
    for (local_30 = 1; local_30 < local_18; local_30 = local_30 + 1) {
      std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),
                 local_30);
      bVar1 = Header::hasType((Header *)0x14111f);
      if (!bVar1) {
        uVar3 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
        __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),
                 local_30);
      std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),
                 local_30);
      getChunkOffsetTableSize(in_stack_fffffffffffffd38);
      Header::setChunkCount
                (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),
                 local_30);
      std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),
                 local_30);
      Header::hasTileDescription((Header *)0x14121d);
      Header::sanityCheck(in_stack_000019c0,(bool)in_stack_000019bf,(bool)in_stack_000019be);
      if ((local_9 & 1) == 0) {
        __s = &local_48;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1412ab);
        in_stack_fffffffffffffd58 =
             (vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88);
        in_stack_fffffffffffffd60 =
             std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                       (in_stack_fffffffffffffd58,0);
        std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                  (in_stack_fffffffffffffd58,local_30);
        uVar2 = checkSharedAttributesValues
                          (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                           in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        local_49 = uVar2;
        if ((bool)uVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffd70),(char *)__s,
                     (allocator<char> *)in_stack_fffffffffffffd60);
          std::allocator<char>::~allocator(&local_71);
          std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                    ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),
                     local_30);
          psVar4 = Header::name_abi_cxx11_((Header *)0x141378);
          std::__cxx11::string::operator+=(local_70,(string *)psVar4);
          local_80 = 0;
          while (uVar6 = local_80,
                sVar5 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&local_48), uVar6 < sVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_48,local_80);
            std::operator+((char *)in_stack_fffffffffffffd78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar2,in_stack_fffffffffffffd70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
            std::__cxx11::string::operator+=(local_70,local_a0);
            std::__cxx11::string::~string(local_a0);
            std::__cxx11::string::~string(local_c0);
            local_80 = local_80 + 1;
          }
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_248);
          std::operator<<((ostream *)&stack0xfffffffffffffdc8,local_70);
          uVar3 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd40);
      }
      else {
        in_stack_fffffffffffffd78 =
             std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                       ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88)
                        ,0);
        std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                  ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x88),
                   local_30);
        overrideSharedAttributesValues
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      }
    }
    headerNameUniquenessCheck(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  return;
}

Assistant:

void
MultiPartOutputFile::Data::do_header_sanity_checks (
    bool overrideSharedAttributes)
{
    size_t parts = _headers.size ();
    if (parts == 0) throw IEX_NAMESPACE::ArgExc ("Empty header list.");

    bool isMultiPart = (parts > 1);

    //
    // Do part 0 checks first.
    //

    _headers[0].sanityCheck (_headers[0].hasTileDescription (), isMultiPart);

    if (isMultiPart)
    {
        // multipart files must contain a chunkCount attribute
        _headers[0].setChunkCount (getChunkOffsetTableSize (_headers[0]));

        for (size_t i = 1; i < parts; i++)
        {
            if (_headers[i].hasType () == false)
                throw IEX_NAMESPACE::ArgExc (
                    "Every header in a multipart file should have a type");

            _headers[i].setChunkCount (getChunkOffsetTableSize (_headers[i]));
            _headers[i].sanityCheck (
                _headers[i].hasTileDescription (), isMultiPart);

            if (overrideSharedAttributes)
                overrideSharedAttributesValues (_headers[0], _headers[i]);
            else
            {
                std::vector<std::string> conflictingAttributes;
                bool                     valid = checkSharedAttributesValues (
                    _headers[0], _headers[i], conflictingAttributes);
                if (valid)
                {
                    string excMsg (
                        "Conflicting attributes found for header :: ");
                    excMsg += _headers[i].name ();
                    for (size_t i = 0; i < conflictingAttributes.size (); i++)
                        excMsg += " '" + conflictingAttributes[i] + "' ";

                    THROW (IEX_NAMESPACE::ArgExc, excMsg);
                }
            }
        }

        headerNameUniquenessCheck (_headers);
    }
    else
    {

        // add chunk count offset to single part data (if not an image)

        if (_headers[0].hasType () && isImage (_headers[0].type ()) == false)
        {
            _headers[0].setChunkCount (getChunkOffsetTableSize (_headers[0]));
        }
    }
}